

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

void int_rel_half_reif_real(IntVar *x,IntRelType t,int c,BoolView *r)

{
  bool bVar1;
  int iVar2;
  Lit LVar3;
  Lit LVar4;
  char *pcVar5;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  vec<Lit> ps2;
  vec<Lit> ps1;
  BoolView b2;
  BoolView b1;
  IntVar *v;
  BoolView *in_stack_fffffffffffffd58;
  IntVar *in_stack_fffffffffffffd60;
  BoolView *in_stack_fffffffffffffd68;
  FILE *__stream;
  vec<Lit> *in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd80;
  undefined1 one_watch;
  vec<Lit> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  Lit in_stack_fffffffffffffda4;
  byte local_221;
  BoolView *in_stack_fffffffffffffe38;
  BoolView *in_stack_fffffffffffffe40;
  BoolRelType in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  BoolView *in_stack_fffffffffffffe58;
  IntVar *in_stack_fffffffffffffe60;
  IntRelType in_stack_fffffffffffffe6c;
  IntVar *in_stack_fffffffffffffe70;
  vec<Lit> local_130 [2];
  int local_10c;
  int local_f4;
  int local_dc;
  vec<Lit> local_d8 [3];
  int in_stack_ffffffffffffff5c;
  anon_union_8_2_743a5d44_for_Reason_0 local_20 [2];
  int local_10;
  int local_c;
  long *local_8;
  
  one_watch = (undefined1)((ulong)in_stack_fffffffffffffd80 >> 0x38);
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar1 = BoolView::isFalse((BoolView *)in_stack_fffffffffffffd60);
  if (!bVar1) {
    bVar1 = BoolView::isTrue((BoolView *)in_stack_fffffffffffffd60);
    if (((bVar1) && (local_c == 1)) && (iVar2 = (**(code **)(*local_8 + 0x18))(), iVar2 == 2)) {
      bVar1 = IntVar::remValNotR(in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58);
      local_221 = 0;
      if (bVar1) {
        Reason::Reason((Reason *)local_20,(Clause *)0x0);
        local_221 = (**(code **)(*local_8 + 0x88))(local_8,(long)local_10,local_20[0]._pt,1);
        local_221 = local_221 ^ 0xff;
      }
      if ((local_221 & 1) != 0) {
        printf("=====UNSATISFIABLE=====\n");
        printf("%% Top level failure!\n");
        exit(0);
      }
    }
    else {
      iVar2 = (**(code **)(*local_8 + 0x18))();
      if (iVar2 == 1) {
        getConstant(in_stack_ffffffffffffff5c);
        int_rel_half_reif(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                          in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                          in_stack_fffffffffffffe54);
      }
      else {
        (**(code **)(*local_8 + 0x68))(local_8,(long)local_10,2);
        BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                           ,in_stack_fffffffffffffda4);
        (**(code **)(*local_8 + 0x68))(local_8,(long)local_10,3);
        BoolView::BoolView((BoolView *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98)
                           ,in_stack_fffffffffffffda4);
        switch(local_c) {
        case 0:
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          operator~(in_stack_fffffffffffffd68);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          bool_rel((BoolView *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          BoolView::~BoolView((BoolView *)0x278649);
          BoolView::~BoolView((BoolView *)0x278656);
          BoolView::~BoolView((BoolView *)0x278663);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          operator~(in_stack_fffffffffffffd68);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          bool_rel((BoolView *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          BoolView::~BoolView((BoolView *)0x2786d6);
          BoolView::~BoolView((BoolView *)0x2786e3);
          BoolView::~BoolView((BoolView *)0x2786f0);
          break;
        case 1:
          vec<Lit>::vec(local_d8);
          operator~(in_stack_fffffffffffffd68);
          local_dc = (int)BoolView::operator_cast_to_Lit(in_stack_fffffffffffffd58);
          vec<Lit>::push(in_stack_fffffffffffffd70,(Lit *)in_stack_fffffffffffffd68);
          BoolView::~BoolView((BoolView *)0x278809);
          operator~(in_stack_fffffffffffffd68);
          local_f4 = (int)BoolView::operator_cast_to_Lit(in_stack_fffffffffffffd58);
          vec<Lit>::push(in_stack_fffffffffffffd70,(Lit *)in_stack_fffffffffffffd68);
          BoolView::~BoolView((BoolView *)0x278862);
          operator~(in_stack_fffffffffffffd68);
          local_10c = (int)BoolView::operator_cast_to_Lit(in_stack_fffffffffffffd58);
          vec<Lit>::push(in_stack_fffffffffffffd70,(Lit *)in_stack_fffffffffffffd68);
          BoolView::~BoolView((BoolView *)0x2788bb);
          SAT::addClause((SAT *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd88,(bool)one_watch);
          vec<Lit>::vec(local_130);
          BoolView::operator_cast_to_Lit(in_stack_fffffffffffffd58);
          vec<Lit>::push(in_stack_fffffffffffffd70,(Lit *)in_stack_fffffffffffffd68);
          LVar3 = BoolView::operator_cast_to_Lit(in_stack_fffffffffffffd58);
          vec<Lit>::push(in_stack_fffffffffffffd70,(Lit *)in_stack_fffffffffffffd68);
          operator~(in_stack_fffffffffffffd68);
          LVar4 = BoolView::operator_cast_to_Lit(in_stack_fffffffffffffd58);
          vec<Lit>::push(in_stack_fffffffffffffd70,(Lit *)in_stack_fffffffffffffd68);
          BoolView::~BoolView((BoolView *)0x2789a5);
          SAT::addClause((SAT *)CONCAT44(LVar3.x,LVar4.x),in_stack_fffffffffffffd88,(bool)one_watch)
          ;
          vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffd60);
          vec<Lit>::~vec((vec<Lit> *)in_stack_fffffffffffffd60);
          break;
        case 2:
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          operator~(in_stack_fffffffffffffd68);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          bool_rel((BoolView *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          BoolView::~BoolView((BoolView *)0x278b43);
          BoolView::~BoolView((BoolView *)0x278b50);
          BoolView::~BoolView((BoolView *)0x278b5d);
          break;
        case 3:
          operator~(in_stack_fffffffffffffd68);
          operator~(in_stack_fffffffffffffd68);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          bool_rel((BoolView *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          BoolView::~BoolView((BoolView *)0x278c2d);
          BoolView::~BoolView((BoolView *)0x278c3a);
          BoolView::~BoolView((BoolView *)0x278c47);
          break;
        case 4:
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          operator~(in_stack_fffffffffffffd68);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          bool_rel((BoolView *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          BoolView::~BoolView((BoolView *)0x278d15);
          BoolView::~BoolView((BoolView *)0x278d22);
          BoolView::~BoolView((BoolView *)0x278d2f);
          break;
        case 5:
          operator~(in_stack_fffffffffffffd68);
          operator~(in_stack_fffffffffffffd68);
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          bool_rel((BoolView *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   in_stack_fffffffffffffe4c,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          BoolView::~BoolView((BoolView *)0x278dff);
          BoolView::~BoolView((BoolView *)0x278e0c);
          BoolView::~BoolView((BoolView *)0x278e19);
          break;
        default:
          __stream = _stderr;
          pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                           ,0x2f);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
            ;
          }
          else {
            pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/primitives/binary.cpp"
                             ,0x2f);
            pcVar5 = pcVar5 + 1;
          }
          fprintf(__stream,"%s:%d: ",pcVar5,0x20e);
          fprintf(_stderr,"Assertion failed.\n");
          abort();
        }
        BoolView::~BoolView((BoolView *)0x278f0d);
        BoolView::~BoolView((BoolView *)0x278f1a);
      }
    }
  }
  return;
}

Assistant:

void int_rel_half_reif_real(IntVar* x, IntRelType t, int c, BoolView r) {
	if (r.isFalse()) {
		return;
	}
	if (r.isTrue() && t == IRT_NE && x->getType() == INT_VAR_EL) {
		TL_SET(x, remVal, c);
		return;
	}
	if (x->getType() == INT_VAR) {
		assert(!so.lazy);
		IntVar* v = getConstant(c);
		int_rel_half_reif(x, t, v, r);
		return;
	}
	BoolView b1(x->getLit(c, LR_GE));
	BoolView b2(x->getLit(c, LR_LE));
	switch (t) {
		case IRT_EQ:
			bool_rel(b2, BRT_OR, ~r);
			bool_rel(b1, BRT_OR, ~r);
			break;
		case IRT_NE: {
			vec<Lit> ps1;
			ps1.push(~b1);
			ps1.push(~b2);
			ps1.push(~r);
			sat.addClause(ps1);
			vec<Lit> ps2;
			ps2.push(b1);
			ps2.push(b2);
			ps2.push(~r);
			sat.addClause(ps2);
		} break;
		case IRT_LE:
			bool_rel(b2, BRT_OR, ~r);
			break;
		case IRT_LT:
			bool_rel(~b1, BRT_OR, ~r);
			break;
		case IRT_GE:
			bool_rel(b1, BRT_OR, ~r);
			break;
		case IRT_GT:
			bool_rel(~b2, BRT_OR, ~r);
			break;
		default:
			NEVER;
	}
}